

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

int __thiscall cmComputeLinkDepends::ComputeComponentCount(cmComputeLinkDepends *this,NodeList *nl)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  cmLinkInterface *pcVar4;
  cmLinkInterface *iface;
  cmGeneratorTarget *target;
  const_iterator cStack_38;
  int ni;
  const_iterator __end1;
  const_iterator __begin1;
  NodeList *__range1;
  uint count;
  NodeList *nl_local;
  cmComputeLinkDepends *this_local;
  
  __range1._4_4_ = 2;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     (&nl->super_vector<int,_std::allocator<int>_>);
  cStack_38 = std::vector<int,_std::allocator<int>_>::end
                        (&nl->super_vector<int,_std::allocator<int>_>);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    pvVar3 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)*piVar2);
    if (((pvVar3->Target != (cmGeneratorTarget *)0x0) &&
        (pcVar4 = cmGeneratorTarget::GetLinkInterface(pvVar3->Target,&this->Config,this->Target),
        pcVar4 != (cmLinkInterface *)0x0)) && (__range1._4_4_ < pcVar4->Multiplicity)) {
      __range1._4_4_ = pcVar4->Multiplicity;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int cmComputeLinkDepends::ComputeComponentCount(NodeList const& nl)
{
  unsigned int count = 2;
  for (int ni : nl) {
    if (cmGeneratorTarget const* target = this->EntryList[ni].Target) {
      if (cmLinkInterface const* iface =
            target->GetLinkInterface(this->Config, this->Target)) {
        if (iface->Multiplicity > count) {
          count = iface->Multiplicity;
        }
      }
    }
  }
  return count;
}